

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseComment(xmlParserCtxtPtr ctxt)

{
  char cVar1;
  int iVar2;
  ulong __n;
  void *pvVar3;
  bool bVar4;
  xmlChar *new_buf;
  int ccol;
  size_t nbchar;
  xmlChar *in;
  size_t maxLength;
  size_t len;
  size_t size;
  xmlChar *buf;
  xmlParserCtxtPtr ctxt_local;
  
  size = 0;
  len = 100;
  maxLength = 0;
  iVar2 = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar2 = 1000000000;
  }
  if ((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) {
    ctxt->input->cur = ctxt->input->cur + 2;
    ctxt->input->col = ctxt->input->col + 2;
    if (*ctxt->input->cur == '\0') {
      xmlParserGrow(ctxt);
    }
    if ((*ctxt->input->cur == '-') && (ctxt->input->cur[1] == '-')) {
      ctxt->input->cur = ctxt->input->cur + 2;
      ctxt->input->col = ctxt->input->col + 2;
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
      if (((ctxt->input->flags & 0x40U) == 0) &&
         ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlParserGrow(ctxt);
      }
      nbchar = (size_t)ctxt->input->cur;
      do {
        cVar1 = *(char *)nbchar;
        while (cVar1 == '\n') {
          ctxt->input->line = ctxt->input->line + 1;
          ctxt->input->col = 1;
          nbchar = nbchar + 1;
          cVar1 = *(char *)nbchar;
        }
        while( true ) {
          while( true ) {
            while( true ) {
              new_buf._4_4_ = ctxt->input->col;
              while( true ) {
                if (((*(byte *)nbchar < 0x2e) || (bVar4 = true, 0x7f < *(byte *)nbchar)) &&
                   ((*(byte *)nbchar < 0x20 || (bVar4 = true, 0x2c < *(byte *)nbchar)))) {
                  bVar4 = *(char *)nbchar == '\t';
                }
                if (!bVar4) break;
                nbchar = nbchar + 1;
                new_buf._4_4_ = new_buf._4_4_ + 1;
              }
              ctxt->input->col = new_buf._4_4_;
              if (*(char *)nbchar != '\n') break;
              do {
                ctxt->input->line = ctxt->input->line + 1;
                ctxt->input->col = 1;
                nbchar = nbchar + 1;
              } while (*(char *)nbchar == '\n');
            }
            __n = nbchar - (long)ctxt->input->cur;
            if (__n != 0) {
              if ((long)iVar2 - maxLength < __n) {
                xmlFatalErrMsgStr(ctxt,XML_ERR_COMMENT_NOT_FINISHED,"Comment too big found",
                                  (xmlChar *)0x0);
                (*xmlFree)((void *)size);
                return;
              }
              if (size == 0) {
                if ((*(char *)nbchar == '-') && (*(char *)(nbchar + 1) == '-')) {
                  len = __n + 1;
                }
                else {
                  len = __n + 100;
                }
                pvVar3 = (*xmlMalloc)(len);
                if (pvVar3 == (void *)0x0) {
                  xmlErrMemory(ctxt);
                  return;
                }
                maxLength = 0;
              }
              else {
                pvVar3 = (void *)size;
                if (len <= maxLength + __n + 1) {
                  len = maxLength + __n + 100 + len;
                  pvVar3 = (*xmlRealloc)((void *)size,len);
                  if (pvVar3 == (void *)0x0) {
                    xmlErrMemory(ctxt);
                    (*xmlFree)((void *)size);
                    return;
                  }
                }
              }
              size = (size_t)pvVar3;
              memcpy((void *)(size + maxLength),ctxt->input->cur,__n);
              maxLength = __n + maxLength;
              *(undefined1 *)(size + maxLength) = 0;
            }
            ctxt->input->cur = (xmlChar *)nbchar;
            if (*(char *)nbchar == '\n') {
              nbchar = nbchar + 1;
              ctxt->input->line = ctxt->input->line + 1;
              ctxt->input->col = 1;
            }
            if ((*(char *)nbchar != '\r') || (*(xmlChar *)(nbchar + 1) != '\n')) break;
            ctxt->input->cur = (xmlChar *)(nbchar + 1);
            nbchar = nbchar + 2;
            ctxt->input->line = ctxt->input->line + 1;
            ctxt->input->col = 1;
          }
          if ((ctxt->input->flags & 0x40U) == 0) {
            xmlParserShrink(ctxt);
          }
          if (((ctxt->input->flags & 0x40U) == 0) &&
             ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
            xmlParserGrow(ctxt);
          }
          nbchar = (size_t)ctxt->input->cur;
          if (*(byte *)nbchar != 0x2d) break;
          if (*(byte *)(nbchar + 1) == 0x2d) {
            if (*(byte *)(nbchar + 2) == 0x3e) {
              ctxt->input->cur = ctxt->input->cur + 3;
              ctxt->input->col = ctxt->input->col + 3;
              if (*ctxt->input->cur == '\0') {
                xmlParserGrow(ctxt);
              }
              if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
                  (ctxt->sax->comment != (commentSAXFunc)0x0)) && (ctxt->disableSAX == 0)) {
                if (size == 0) {
                  (*ctxt->sax->comment)(ctxt->userData,"");
                }
                else {
                  (*ctxt->sax->comment)(ctxt->userData,(xmlChar *)size);
                }
              }
              if (size == 0) {
                return;
              }
              (*xmlFree)((void *)size);
              return;
            }
            if (size == 0) {
              xmlFatalErrMsgStr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,"Double hyphen within comment\n",
                                (xmlChar *)0x0);
            }
            else {
              xmlFatalErrMsgStr(ctxt,XML_ERR_HYPHEN_IN_COMMENT,
                                "Double hyphen within comment: <!--%.50s\n",(xmlChar *)size);
            }
            nbchar = nbchar + 1;
            ctxt->input->col = ctxt->input->col + 1;
          }
          nbchar = nbchar + 1;
          ctxt->input->col = ctxt->input->col + 1;
        }
        if (((*(byte *)nbchar < 0x20) || (bVar4 = true, 0x7f < *(byte *)nbchar)) &&
           (bVar4 = true, *(byte *)nbchar != 9)) {
          bVar4 = *(byte *)nbchar == 10;
        }
      } while (bVar4);
      xmlParseCommentComplex(ctxt,(xmlChar *)size,maxLength,len);
    }
  }
  return;
}

Assistant:

void
xmlParseComment(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t len = 0;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    const xmlChar *in;
    size_t nbchar = 0;
    int ccol;

    /*
     * Check that there is a comment right here.
     */
    if ((RAW != '<') || (NXT(1) != '!'))
        return;
    SKIP(2);
    if ((RAW != '-') || (NXT(1) != '-'))
        return;
    SKIP(2);
    GROW;

    /*
     * Accelerated common case where input don't need to be
     * modified before passing it to the handler.
     */
    in = ctxt->input->cur;
    do {
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	}
get_more:
        ccol = ctxt->input->col;
	while (((*in > '-') && (*in <= 0x7F)) ||
	       ((*in >= 0x20) && (*in < '-')) ||
	       (*in == 0x09)) {
		    in++;
		    ccol++;
	}
	ctxt->input->col = ccol;
	if (*in == 0xA) {
	    do {
		ctxt->input->line++; ctxt->input->col = 1;
		in++;
	    } while (*in == 0xA);
	    goto get_more;
	}
	nbchar = in - ctxt->input->cur;
	/*
	 * save current set of data
	 */
	if (nbchar > 0) {
            if (nbchar > maxLength - len) {
                xmlFatalErrMsgStr(ctxt, XML_ERR_COMMENT_NOT_FINISHED,
                                  "Comment too big found", NULL);
                xmlFree(buf);
                return;
            }
            if (buf == NULL) {
                if ((*in == '-') && (in[1] == '-'))
                    size = nbchar + 1;
                else
                    size = XML_PARSER_BUFFER_SIZE + nbchar;
                buf = xmlMalloc(size);
                if (buf == NULL) {
                    xmlErrMemory(ctxt);
                    return;
                }
                len = 0;
            } else if (len + nbchar + 1 >= size) {
                xmlChar *new_buf;
                size += len + nbchar + XML_PARSER_BUFFER_SIZE;
                new_buf = xmlRealloc(buf, size);
                if (new_buf == NULL) {
                    xmlErrMemory(ctxt);
                    xmlFree(buf);
                    return;
                }
                buf = new_buf;
            }
            memcpy(&buf[len], ctxt->input->cur, nbchar);
            len += nbchar;
            buf[len] = 0;
	}
	ctxt->input->cur = in;
	if (*in == 0xA) {
	    in++;
	    ctxt->input->line++; ctxt->input->col = 1;
	}
	if (*in == 0xD) {
	    in++;
	    if (*in == 0xA) {
		ctxt->input->cur = in;
		in++;
		ctxt->input->line++; ctxt->input->col = 1;
		goto get_more;
	    }
	    in--;
	}
	SHRINK;
	GROW;
	in = ctxt->input->cur;
	if (*in == '-') {
	    if (in[1] == '-') {
	        if (in[2] == '>') {
		    SKIP(3);
		    if ((ctxt->sax != NULL) && (ctxt->sax->comment != NULL) &&
		        (!ctxt->disableSAX)) {
			if (buf != NULL)
			    ctxt->sax->comment(ctxt->userData, buf);
			else
			    ctxt->sax->comment(ctxt->userData, BAD_CAST "");
		    }
		    if (buf != NULL)
		        xmlFree(buf);
		    return;
		}
		if (buf != NULL) {
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment: "
                                      "<!--%.50s\n",
				      buf);
		} else
		    xmlFatalErrMsgStr(ctxt, XML_ERR_HYPHEN_IN_COMMENT,
		                      "Double hyphen within comment\n", NULL);
		in++;
		ctxt->input->col++;
	    }
	    in++;
	    ctxt->input->col++;
	    goto get_more;
	}
    } while (((*in >= 0x20) && (*in <= 0x7F)) || (*in == 0x09) || (*in == 0x0a));
    xmlParseCommentComplex(ctxt, buf, len, size);
}